

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnNullable::Append(ColumnNullable *this,ColumnRef *column)

{
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  shared_ptr<clickhouse::ColumnNullable> col;
  undefined1 local_70 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  Column::As<clickhouse::ColumnNullable>((Column *)local_70);
  if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
    std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               (__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> *)
               (*(_func_int **)(local_70._0_8_ + 0x28) + 0x18));
    std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               &(((this->nested_).super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>);
    bVar3 = Type::IsEqual(local_30._M_ptr,(TypeRef *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    if (bVar3) {
      peVar1 = (this->nested_).super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      std::__shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 (__shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_70._0_8_ + 0x28));
      (*peVar1->_vptr_Column[2])(peVar1,&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      peVar2 = (this->nulls_).
               super___shared_ptr<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<clickhouse::ColumnVector<unsigned_char>,void>
                ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x10),
                 (__shared_ptr<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                  *)(local_70._0_8_ + 0x38));
      (*(peVar2->super_Column)._vptr_Column[2])
                (peVar2,(__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)
                        (local_70 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  return;
}

Assistant:

void ColumnNullable::Append(ColumnRef column) {
    if (auto col = column->As<ColumnNullable>()) {
        if (!col->nested_->Type()->IsEqual(nested_->Type())) {
            return;
        }

        nested_->Append(col->nested_);
        nulls_->Append(col->nulls_);
    }
}